

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<kj::String>(Promise<void> *this,String *attachments)

{
  AttachmentPromiseNode<kj::String> *pAVar1;
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Own<kj::_::AttachmentPromiseNode<kj::String>_> local_40;
  Array<char> local_30;
  Own<kj::_::PromiseNode> local_18;
  
  local_30.ptr = (char *)*in_RDX;
  local_30.size_ = in_RDX[1];
  local_30.disposer = (ArrayDisposer *)in_RDX[2];
  *in_RDX = 0;
  in_RDX[1] = 0;
  heap<kj::_::AttachmentPromiseNode<kj::String>,kj::Own<kj::_::PromiseNode>,kj::String>
            ((kj *)&local_40,(Own<kj::_::PromiseNode> *)attachments,(String *)&local_30);
  pAVar1 = local_40.ptr;
  local_18.disposer = local_40.disposer;
  local_40.ptr = (AttachmentPromiseNode<kj::String> *)0x0;
  (this->super_PromiseBase).node.disposer = local_40.disposer;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)pAVar1;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_18);
  Own<kj::_::AttachmentPromiseNode<kj::String>_>::dispose(&local_40);
  Array<char>::~Array(&local_30);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}